

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *comp,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  ExpressionKind EVar1;
  SourceLocation SVar2;
  AssertionInstanceExpression *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  SourceRange range;
  bool bVar8;
  bool bVar9;
  Type *pTVar10;
  Symbol *value;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar11;
  SourceLocation SVar12;
  Diagnostic *this_00;
  InvalidExpression *pIVar13;
  SourceLocation SVar14;
  ulong uVar15;
  Compilation *comp_00;
  Token *this_01;
  InvocationExpressionSyntax *pIVar16;
  long lVar17;
  AssertionInstanceExpression *this_02;
  long lVar18;
  MemberSelector *selector;
  SourceRange sourceRange_00;
  SourceRange range_00;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange SVar19;
  SourceRange sourceRange_03;
  HierarchicalReference hierRef;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  ASTContext *in_stack_fffffffffffffd28;
  SourceRange local_2c0;
  InvocationExpressionSyntax *local_2b0;
  SourceLocation local_2a8;
  InvalidExpression *local_2a0;
  Compilation *local_298;
  undefined1 local_290 [24];
  undefined1 local_278 [32];
  Scope *local_258;
  Symbol *local_250;
  undefined1 local_248 [192];
  Type *local_188;
  Type *local_180;
  Type *local_178;
  undefined1 local_170 [72];
  Type *local_128;
  Type *local_120;
  Diagnostic local_118 [2];
  
  SVar14 = sourceRange.endLoc;
  local_2c0.endLoc = sourceRange.startLoc;
  this_02 = (AssertionInstanceExpression *)(comp->super_BumpAllocator).head;
  local_2c0.startLoc = (SourceLocation)result;
  if (this_02 == (AssertionInstanceExpression *)0x0) {
    local_278._0_8_ = (Symbol *)0x0;
    goto LAB_0086f234;
  }
  SVar12 = SVar14;
  pIVar16 = invocation;
  if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 4) == 0) ||
     (bVar9 = Symbol::isType((Symbol *)this_02), !bVar9)) {
    if (((((this_02->super_Expression).kind == (Dist|StructuredAssignmentPattern)) &&
         (((lVar17._0_4_ = (comp->options).maxConstexprDepth,
           lVar17._4_4_ = (comp->options).maxConstexprSteps, lVar17 == 0 &&
           (((ulong)this_02[3].super_Expression.syntax & 0x200000000) != 0)) &&
          (SVar2 = (this_02->super_Expression).sourceRange.startLoc, SVar2 != (SourceLocation)0x0)))
         ) && ((SVar14 != (SourceLocation)0x0 ||
               ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100)
                 != 0 && (((ulong)this->constant & 0x200) != 0)))))) &&
       ((pAVar3 = *(AssertionInstanceExpression **)((long)SVar2 + 8),
        (pAVar3->super_Expression).kind == 0x40 &&
        (*(AssertionInstanceExpression **)&pAVar3[2].super_Expression == this_02)))) {
      this_02 = pAVar3;
    }
    EVar1 = (this_02->super_Expression).kind;
    if ((int)EVar1 < 0x4f) {
      if (EVar1 == 0x40) {
        if (SVar14 == (SourceLocation)0x0) {
          local_290._16_8_ = local_2c0.endLoc;
          local_290._8_8_ = local_2c0.startLoc;
        }
        else {
          local_290._8_16_ =
               (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar14);
        }
        local_248[0] = 0;
        in_stack_fffffffffffffd20 = local_290[0x10];
        in_stack_fffffffffffffd21 = local_290._17_7_;
        local_278._0_8_ = this_02;
        value = (Symbol *)
                CallExpression::fromLookup
                          ((CallExpression *)this,(Compilation *)local_278,(Subroutine *)0x0,
                           (Expression *)SVar14,invocation,withClause,(SourceRange)local_290._8_16_,
                           in_stack_fffffffffffffd28);
        SVar14 = (SourceLocation)0x0;
        invocation = (InvocationExpressionSyntax *)0x0;
      }
      else {
        if (EVar1 == 0x48) {
          lVar18._0_4_ = (comp->options).maxConstexprDepth;
          lVar18._4_4_ = (comp->options).maxConstexprSteps;
          SVar12._1_7_ = 0;
          SVar12._0_1_ = lVar18 != 0;
          HierarchicalReference::fromLookup
                    ((HierarchicalReference *)local_278,(Compilation *)this,(LookupResult *)comp);
          bVar9 = false;
        }
        else {
LAB_0086ed8f:
          bVar9 = false;
          if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100000)
               != 0) &&
             (lVar6._0_4_ = (comp->options).maxConstexprDepth,
             lVar6._4_4_ = (comp->options).maxConstexprSteps, bVar9 = false, lVar6 != 0)) {
            lVar17 = *(long *)&(comp->options).maxCheckerInstanceDepth;
            if (lVar17 == 0) {
              bVar9 = false;
            }
            else {
              bVar9 = *(char *)(lVar17 + 0x28) == '\x01';
            }
          }
          HierarchicalReference::fromLookup
                    ((HierarchicalReference *)local_278,(Compilation *)this,(LookupResult *)comp);
          SVar12 = (SourceLocation)0x0;
        }
        sourceRange_03.endLoc = SVar12;
        sourceRange_03.startLoc = local_2c0.endLoc;
        value = (Symbol *)
                ValueExpressionBase::fromSymbol
                          ((ValueExpressionBase *)withClause,(ASTContext *)this_02,
                           (Symbol *)local_278,(HierarchicalReference *)local_2c0.startLoc,
                           sourceRange_03,bVar9,(bool)in_stack_fffffffffffffd20);
      }
    }
    else {
      if (1 < EVar1 - 0x4f) {
        if (EVar1 == 0x51) {
          SVar19.endLoc = (SourceLocation)withClause;
          SVar19.startLoc = local_2c0.endLoc;
          value = (Symbol *)
                  AssertionInstanceExpression::bindPort
                            (this_02,(Symbol *)local_2c0.startLoc,SVar19,(ASTContext *)SVar12);
          goto LAB_0086eed1;
        }
        if (EVar1 != 0x55) goto LAB_0086ed8f;
      }
      lVar4._0_4_ = (comp->options).maxConstexprDepth;
      lVar4._4_4_ = (comp->options).maxConstexprSteps;
      SVar12 = (SourceLocation)0x0;
      if (lVar4 == 0) {
        SVar12 = SVar14;
        SVar14 = (SourceLocation)0x0;
      }
      range_00.endLoc = (SourceLocation)withClause;
      range_00.startLoc = local_2c0.endLoc;
      local_2b0 = invocation;
      value = (Symbol *)
              AssertionInstanceExpression::fromLookup
                        (this_02,(Symbol *)SVar12,(InvocationExpressionSyntax *)local_2c0.startLoc,
                         range_00,(ASTContext *)pIVar16);
      invocation = local_2b0;
      if (((this_02->super_Expression).kind == 0x55) &&
         (((comp->options).maxInstanceDepth & 2) != 0)) {
        if (SVar12 == (SourceLocation)0x0) {
          sourceRange_02.endLoc = local_2c0.endLoc;
          sourceRange_02.startLoc = local_2c0.startLoc;
        }
        else {
          sourceRange_02 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar12);
        }
        ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x690007,sourceRange_02);
      }
    }
LAB_0086eed1:
    lVar5._0_4_ = (comp->options).maxConstexprDepth;
    lVar5._4_4_ = (comp->options).maxConstexprSteps;
    bVar9 = lVar5 != 0;
    local_2b0 = invocation;
    local_2a8 = SVar14;
    if (bVar9) {
      lVar18 = 0;
      lVar17 = 0;
      uVar15 = 0;
      local_298 = (Compilation *)this;
      do {
        lVar6 = *(long *)&(comp->options).maxCheckerInstanceDepth;
        if (lVar6 == 0) {
          selector = (MemberSelector *)0x0;
        }
        else {
          selector = (MemberSelector *)0x0;
          if (*(char *)(lVar6 + 0x28 + lVar17) == '\x01') {
            selector = (MemberSelector *)(lVar6 + lVar17);
          }
        }
        if (selector == (MemberSelector *)0x0) {
          ppEVar11 = std::
                     get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                               ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                 *)(lVar6 + lVar17));
          value = (Symbol *)
                  bindSelector((Compilation *)this,(Expression *)value,*ppEVar11,
                               (ASTContext *)withClause);
          bVar8 = true;
        }
        else {
          pTVar10 = (Type *)(value->name)._M_len;
          if (pTVar10->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar10);
          }
          this = (Expression *)local_298;
          SVar14 = local_2a8;
          pIVar16 = local_2b0;
          if ((pTVar10->canonical->super_Symbol).kind == VirtualInterfaceType) {
            local_278._0_8_ = (AssertionInstanceExpression *)0x0;
            local_278._8_5_ = 0;
            local_278._13_3_ = 0;
            local_278._16_5_ = 0;
            local_278._24_8_ = local_248;
            local_258 = (Scope *)0x0;
            local_250 = (Symbol *)0x4;
            local_188 = (Type *)local_170;
            local_180 = (Type *)0x0;
            local_178 = (Type *)0x2;
            local_170._64_8_ = local_118;
            local_128 = (Type *)0x0;
            local_120 = (Type *)0x2;
            selectors._M_extent._M_extent_value =
                 *(long *)&(comp->options).maxConstexprDepth + lVar18;
            selectors._M_ptr = (pointer)(*(long *)&(comp->options).maxCheckerInstanceDepth + lVar17)
            ;
            comp_00 = (Compilation *)local_278;
            Lookup::selectChild((Type *)(value->name)._M_len,*(SourceRange *)&value->parentScope,
                                selectors,(ASTContext *)withClause,(LookupResult *)comp_00);
            this = (Expression *)local_298;
            LookupResult::reportDiags((LookupResult *)comp_00,(ASTContext *)withClause);
            if ((AssertionInstanceExpression *)local_278._0_8_ == (AssertionInstanceExpression *)0x0
               ) {
              comp_00 = (Compilation *)local_290;
              local_290._0_8_ = value;
              local_2a0 = BumpAllocator::
                          emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                                    ((BumpAllocator *)this,(Expression **)comp_00,
                                     ((Compilation *)this)->errorType);
            }
            else {
              sourceRange_01.endLoc = local_2a8;
              sourceRange_01.startLoc = local_2c0.endLoc;
              local_2a0 = (InvalidExpression *)
                          bindLookupResult(this,comp_00,(LookupResult *)local_2c0.startLoc,
                                           sourceRange_01,local_2b0,withClause,
                                           (ASTContext *)
                                           CONCAT71(in_stack_fffffffffffffd21,
                                                    in_stack_fffffffffffffd20));
            }
            SmallVectorBase<slang::Diagnostic>::cleanup
                      ((SmallVectorBase<slang::Diagnostic> *)(local_170 + 0x40),
                       (EVP_PKEY_CTX *)comp_00);
            if (local_188 != (Type *)local_170) {
              operator_delete(local_188);
            }
            if ((undefined1 *)local_278._24_8_ != local_248) {
              operator_delete((void *)local_278._24_8_);
            }
            bVar8 = false;
          }
          else {
            if (uVar15 == *(long *)&(comp->options).maxConstexprDepth - 1U) {
              value = (Symbol *)
                      MemberAccessExpression::fromSelector
                                (local_298,(Expression *)value,selector,
                                 (InvocationExpressionSyntax *)local_2a8,
                                 (ArrayOrRandomizeMethodExpressionSyntax *)local_2b0,
                                 (ASTContext *)withClause,true);
              local_2b0 = pIVar16;
              local_2a8 = SVar14;
              if (value->kind == Call) {
                local_2a8 = (SourceLocation)0x0;
                local_2b0 = (InvocationExpressionSyntax *)0x0;
              }
            }
            else {
              value = (Symbol *)
                      MemberAccessExpression::fromSelector
                                (local_298,(Expression *)value,selector,
                                 (InvocationExpressionSyntax *)0x0,
                                 (ArrayOrRandomizeMethodExpressionSyntax *)0x0,
                                 (ASTContext *)withClause,true);
            }
            bVar8 = true;
          }
        }
        if (!bVar8) break;
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x30;
        lVar18 = lVar18 + -1;
        uVar7._0_4_ = (comp->options).maxConstexprDepth;
        uVar7._4_4_ = (comp->options).maxConstexprSteps;
        bVar9 = uVar15 < uVar7;
      } while (bVar9);
    }
    SVar14 = local_2a8;
    if (bVar9) {
      return &local_2a0->super_Expression;
    }
    bVar9 = bad((Expression *)value);
    if (bVar9) {
      return (Expression *)value;
    }
    if (SVar14 != (SourceLocation)0x0) {
      SVar14 = *(SourceLocation *)((long)SVar14 + 0x58);
      goto LAB_0086f1c3;
    }
    if (local_2b0 == (InvocationExpressionSyntax *)0x0) {
      return (Expression *)value;
    }
    this_01 = (Token *)&local_2b0->attributes;
  }
  else {
    sourceRange_00.endLoc = (SourceLocation)withClause;
    sourceRange_00.startLoc = local_2c0.endLoc;
    pTVar10 = Type::fromLookupResult
                        ((Type *)this,comp,(LookupResult *)local_2c0.startLoc,sourceRange_00,
                         (ASTContext *)pIVar16);
    value = (Symbol *)
            BumpAllocator::
            emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                      ((BumpAllocator *)this,pTVar10,&local_2c0);
    bVar9 = bad((Expression *)value);
    if (bVar9) {
      return (Expression *)value;
    }
    if (SVar14 != (SourceLocation)0x0) {
      SVar14 = *(SourceLocation *)((long)SVar14 + 0x58);
LAB_0086f1c3:
      SVar12 = local_2c0.startLoc;
      if (SVar14 != (SourceLocation)0x0) {
        SVar12 = parsing::Token::location((Token *)((long)SVar14 + 0x18));
      }
      this_00 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x570007,SVar12);
      range.endLoc = local_2c0.endLoc;
      range.startLoc = local_2c0.startLoc;
      Diagnostic::operator<<(this_00,range);
      local_278._0_8_ = value;
      goto LAB_0086f234;
    }
    if (invocation == (InvocationExpressionSyntax *)0x0) {
      return (Expression *)value;
    }
    this_01 = (Token *)&invocation->attributes;
  }
  SVar19 = parsing::Token::range(this_01);
  ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa50007,SVar19);
  local_278._0_8_ = value;
LAB_0086f234:
  pIVar13 = BumpAllocator::
            emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                      ((BumpAllocator *)this,(Expression **)local_278,
                       ((Compilation *)this)->errorType);
  return &pIVar13->super_Expression;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& comp, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(comp, result, sourceRange, context);
        auto expr = comp.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(comp, expr);

        return *expr;
    }

    // If we've found a function's return value variable and have parentheses for
    // a call expression, translate that symbol to be the subroutine itself to
    // allow for recursive function calls.
    if (symbol->kind == SymbolKind::Variable && result.selectors.empty() &&
        symbol->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {

        auto scope = symbol->getParentScope();
        if (scope && (invocation || (context.flags.has(ASTFlags::TopLevelStatement) &&
                                     comp.hasFlag(CompilationFlags::AllowRecursiveImplicitCall)))) {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::Subroutine &&
                sym.as<SubroutineSymbol>().returnValVar == symbol) {
                SLANG_ASSERT(sym.as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function);
                symbol = &sym;
            }
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            SLANG_ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(comp, &symbol->as<SubroutineSymbol>(), nullptr,
                                               invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl &&
                result.flags.has(LookupResultFlags::IsHierarchical)) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            const bool constraintAllowed = !result.selectors.empty();
            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    constraintAllowed);
            break;
        }
        default: {
            const bool isDottedAccess =
                context.flags.has(ASTFlags::LValue) && !result.selectors.empty() &&
                std::get_if<LookupResult::MemberSelector>(&result.selectors[0]) != nullptr;

            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    /* constraintAllowed */ false, isDottedAccess);
            break;
        }
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                std::span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(comp, expr);

                return bindLookupResult(comp, nextResult, sourceRange, invocation, withClause,
                                        context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, invocation,
                                                             withClause, context,
                                                             /* isFromLookupChain */ true);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, nullptr,
                                                             nullptr, context,
                                                             /* isFromLookupChain */ true);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(comp, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(comp, expr);

    return *expr;
}